

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<unsigned_long,unsigned_long,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  byte fun_00;
  bool bVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  bool *pbVar4;
  byte in_CL;
  Vector *in_RDX;
  undefined8 in_RDI;
  Vector *unaff_retaddr;
  bool *result_data;
  unsigned_long *rdata;
  unsigned_long *ldata;
  ValidityMask *in_stack_ffffffffffffffa8;
  unsigned_long right_00;
  unsigned_long left_00;
  undefined8 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 is_null;
  
  is_null = (undefined1)((ulong)in_RDI >> 0x38);
  fun_00 = in_CL & 1;
  Vector::SetVectorType
            ((Vector *)(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
             (VectorType)((ulong)in_stack_ffffffffffffffd8 >> 0x38));
  puVar2 = ConstantVector::GetData<unsigned_long>((Vector *)0x505204);
  puVar3 = ConstantVector::GetData<unsigned_long>((Vector *)0x505213);
  pbVar4 = ConstantVector::GetData<bool>((Vector *)0x505222);
  bVar1 = ConstantVector::IsNull((Vector *)0x505231);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x50523f), !bVar1)) {
    right_00 = *puVar2;
    left_00 = *puVar3;
    ConstantVector::Validity(in_RDX);
    bVar1 = BinarySingleArgumentOperatorWrapper::
            Operation<bool,duckdb::NotEquals,unsigned_long,unsigned_long,bool>
                      ((bool)fun_00,left_00,right_00,in_stack_ffffffffffffffa8,0x5052a2);
    *pbVar4 = bVar1;
    return;
  }
  ConstantVector::SetNull(unaff_retaddr,(bool)is_null);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}